

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_SetLag(Abc_Obj_t *pObj,int lag)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  int lag_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                  ,0x53f,"void Abc_FlowRetime_SetLag(Abc_Obj_t *, int)");
  }
  uVar2 = Abc_ObjId(pObj);
  iVar1 = Vec_IntSize(pManMR->vLags);
  if ((int)uVar2 < iVar1) {
    p = pManMR->vLags;
    uVar2 = Abc_ObjId(pObj);
    Vec_IntWriteEntry(p,uVar2,lag);
    return;
  }
  __assert_fail("(int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                ,0x540,"void Abc_FlowRetime_SetLag(Abc_Obj_t *, int)");
}

Assistant:

void 
Abc_FlowRetime_SetLag( Abc_Obj_t *pObj, int lag ) {
  assert( Abc_ObjIsNode(pObj) );
  assert( (int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags) );

  Vec_IntWriteEntry(pManMR->vLags, Abc_ObjId(pObj), lag);
}